

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportTryCompileFileGenerator.cxx
# Opt level: O1

string * __thiscall
cmExportTryCompileFileGenerator::FindTargets
          (string *__return_storage_ptr__,cmExportTryCompileFileGenerator *this,string *propName,
          cmGeneratorTarget *tgt,string *language,
          set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
          *emitted)

{
  pointer *pppcVar1;
  pointer pcVar2;
  iterator __position;
  cmGeneratorExpressionDAGChecker *pcVar3;
  element_type *peVar4;
  cmGeneratorExpressionDAGChecker *pcVar5;
  int iVar6;
  cmake *pcVar7;
  cmMakefile *mf;
  cmLocalGenerator *pcVar8;
  string *psVar9;
  _Rb_tree_node_base *p_Var10;
  _Rb_tree_header *p_Var11;
  pair<std::_Rb_tree_iterator<const_cmGeneratorTarget_*>,_bool> pVar12;
  unique_ptr<cmGeneratorExpressionDAGChecker,_std::default_delete<cmGeneratorExpressionDAGChecker>_>
  parentDagChecker;
  unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_> cge
  ;
  cmTarget dummyHead;
  cmGeneratorTarget *target;
  cmGeneratorExpression ge;
  cmGeneratorExpressionDAGChecker dagChecker;
  cmGeneratorTarget gDummyHead;
  cmGeneratorExpressionDAGChecker *local_c08;
  string *local_c00;
  cmGeneratorExpression local_bf8;
  cmGeneratorExpressionDAGChecker *local_be0;
  cmGeneratorTarget *local_bd8;
  string *local_bd0;
  long *local_bc8 [2];
  long local_bb8 [2];
  string local_ba8;
  cmConstStack<cmListFileContext,_cmListFileBacktrace> local_b88;
  undefined1 local_b70 [24];
  cmGeneratorExpressionDAGChecker local_b58;
  undefined1 local_ad8 [2728];
  
  local_c00 = (string *)cmGeneratorTarget::GetProperty(tgt,propName);
  if (local_c00 == (string *)0x0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  else {
    local_bf8.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
    super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)__return_storage_ptr__;
    local_bd0 = language;
    pcVar7 = cmMakefile::GetCMakeInstance(tgt->Makefile);
    local_b88.TopEntry.
    super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)0x0;
    local_b88.TopEntry.
    super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    cmConstStack<cmListFileContext,_cmListFileBacktrace>::cmConstStack(&local_b88);
    cmGeneratorExpression::cmGeneratorExpression
              ((cmGeneratorExpression *)local_b70,pcVar7,(cmListFileBacktrace *)&local_b88);
    if (local_b88.TopEntry.
        super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_b88.TopEntry.
                 super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
    local_c08 = (cmGeneratorExpressionDAGChecker *)0x0;
    iVar6 = std::__cxx11::string::compare((char *)propName);
    if (iVar6 == 0) {
      local_be0 = (cmGeneratorExpressionDAGChecker *)operator_new(0x80);
      local_ad8._0_8_ = local_ad8 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_ad8,"LINK_OPTIONS","");
      pcVar3 = local_be0;
      cmGeneratorExpressionDAGChecker::cmGeneratorExpressionDAGChecker
                (local_be0,tgt,(string *)local_ad8,(GeneratorExpressionContent *)0x0,
                 (cmGeneratorExpressionDAGChecker *)0x0);
      local_b58.Parent = pcVar3;
      if ((undefined1 *)local_ad8._0_8_ != local_ad8 + 0x10) {
        operator_delete((void *)local_ad8._0_8_,local_ad8._16_8_ + 1);
      }
      pcVar5 = local_b58.Parent;
      pcVar3 = local_c08;
      local_b58.Parent = (cmGeneratorExpressionDAGChecker *)0x0;
      local_c08 = pcVar5;
      if (pcVar3 != (cmGeneratorExpressionDAGChecker *)0x0) {
        std::default_delete<cmGeneratorExpressionDAGChecker>::operator()
                  ((default_delete<cmGeneratorExpressionDAGChecker> *)&local_c08,pcVar3);
      }
      if (local_b58.Parent != (cmGeneratorExpressionDAGChecker *)0x0) {
        std::default_delete<cmGeneratorExpressionDAGChecker>::operator()
                  ((default_delete<cmGeneratorExpressionDAGChecker> *)(local_b70 + 0x18),
                   local_b58.Parent);
      }
    }
    pcVar2 = (propName->_M_dataplus)._M_p;
    local_ba8._M_dataplus._M_p = (pointer)&local_ba8.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_ba8,pcVar2,pcVar2 + propName->_M_string_length);
    cmGeneratorExpressionDAGChecker::cmGeneratorExpressionDAGChecker
              ((cmGeneratorExpressionDAGChecker *)(local_b70 + 0x18),tgt,&local_ba8,
               (GeneratorExpressionContent *)0x0,local_c08);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_ba8._M_dataplus._M_p != &local_ba8.field_2) {
      operator_delete(local_ba8._M_dataplus._M_p,local_ba8.field_2._M_allocated_capacity + 1);
    }
    pcVar2 = (local_c00->_M_dataplus)._M_p;
    local_bc8[0] = local_bb8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_bc8,pcVar2,pcVar2 + local_c00->_M_string_length);
    cmGeneratorExpression::Parse(&local_bf8,(string *)local_b70);
    if (local_bc8[0] != local_bb8) {
      operator_delete(local_bc8[0],local_bb8[0] + 1);
    }
    local_ad8._0_8_ = local_ad8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_ad8,"try_compile_dummy_exe","");
    mf = cmTarget::GetMakefile(tgt->Target);
    cmTarget::cmTarget((cmTarget *)
                       &local_bf8.Backtrace.
                        super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
                        super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount,(string *)local_ad8,EXECUTABLE,Normal,mf,Yes);
    if ((undefined1 *)local_ad8._0_8_ != local_ad8 + 0x10) {
      operator_delete((void *)local_ad8._0_8_,local_ad8._16_8_ + 1);
    }
    pcVar8 = cmGeneratorTarget::GetLocalGenerator(tgt);
    peVar4 = local_bf8.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry
             .
             super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    cmGeneratorTarget::cmGeneratorTarget
              ((cmGeneratorTarget *)local_ad8,
               (cmTarget *)
               &local_bf8.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
                TopEntry.
                super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount,pcVar8);
    pcVar7 = local_bf8.CMakeInstance;
    pcVar8 = cmGeneratorTarget::GetLocalGenerator(tgt);
    psVar9 = cmCompiledGeneratorExpression::Evaluate
                       ((cmCompiledGeneratorExpression *)pcVar7,pcVar8,&this->Config,
                        (cmGeneratorTarget *)local_ad8,
                        (cmGeneratorExpressionDAGChecker *)(local_b70 + 0x18),tgt,local_bd0);
    local_c00 = (string *)&(peVar4->Value).Name.field_2;
    (peVar4->Value).Name._M_dataplus._M_p = (pointer)local_c00;
    pcVar2 = (psVar9->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)peVar4,pcVar2,pcVar2 + psVar9->_M_string_length);
    p_Var10 = (((set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
                 *)&(local_bf8.CMakeInstance)->GeneratorPlatform)->_M_t)._M_impl.
              super__Rb_tree_header._M_header._M_left;
    p_Var11 = &(((set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
                  *)&(local_bf8.CMakeInstance)->GeneratorPlatform)->_M_t)._M_impl.
               super__Rb_tree_header;
    if ((_Rb_tree_header *)p_Var10 != p_Var11) {
      do {
        local_bd8 = *(cmGeneratorTarget **)(p_Var10 + 1);
        pVar12 = std::
                 _Rb_tree<cmGeneratorTarget_const*,cmGeneratorTarget_const*,std::_Identity<cmGeneratorTarget_const*>,std::less<cmGeneratorTarget_const*>,std::allocator<cmGeneratorTarget_const*>>
                 ::_M_insert_unique<cmGeneratorTarget_const*const&>
                           ((_Rb_tree<cmGeneratorTarget_const*,cmGeneratorTarget_const*,std::_Identity<cmGeneratorTarget_const*>,std::less<cmGeneratorTarget_const*>,std::allocator<cmGeneratorTarget_const*>>
                             *)emitted,&local_bd8);
        if (((undefined1  [16])pVar12 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          __position._M_current =
               (this->Exports).
               super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          if (__position._M_current ==
              (this->Exports).
              super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<cmGeneratorTarget_const*,std::allocator<cmGeneratorTarget_const*>>::
            _M_realloc_insert<cmGeneratorTarget_const*const&>
                      ((vector<cmGeneratorTarget_const*,std::allocator<cmGeneratorTarget_const*>> *)
                       &this->Exports,__position,&local_bd8);
          }
          else {
            *__position._M_current = local_bd8;
            pppcVar1 = &(this->Exports).
                        super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
            *pppcVar1 = *pppcVar1 + 1;
          }
        }
        p_Var10 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var10);
      } while ((_Rb_tree_header *)p_Var10 != p_Var11);
    }
    cmGeneratorTarget::~cmGeneratorTarget((cmGeneratorTarget *)local_ad8);
    cmTarget::~cmTarget((cmTarget *)
                        &local_bf8.Backtrace.
                         super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
                         super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount);
    std::
    unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>::
    ~unique_ptr((unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                 *)&local_bf8);
    if (local_b58.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
        super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_b58.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
                 TopEntry.
                 super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
    std::
    _Rb_tree<const_cmGeneratorTarget_*,_std::pair<const_cmGeneratorTarget_*const,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_cmGeneratorTarget_*const,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
    ::~_Rb_tree(&local_b58.Seen._M_t);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b58.Property._M_dataplus._M_p != &local_b58.Property.field_2) {
      operator_delete(local_b58.Property._M_dataplus._M_p,
                      local_b58.Property.field_2._M_allocated_capacity + 1);
    }
    __return_storage_ptr__ =
         (string *)
         local_bf8.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
         super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
         ._M_ptr;
    if (local_c08 != (cmGeneratorExpressionDAGChecker *)0x0) {
      std::default_delete<cmGeneratorExpressionDAGChecker>::operator()
                ((default_delete<cmGeneratorExpressionDAGChecker> *)&local_c08,local_c08);
    }
    cmGeneratorExpression::~cmGeneratorExpression((cmGeneratorExpression *)local_b70);
  }
  return (string *)(element_type *)__return_storage_ptr__;
}

Assistant:

std::string cmExportTryCompileFileGenerator::FindTargets(
  const std::string& propName, cmGeneratorTarget const* tgt,
  std::string const& language, std::set<cmGeneratorTarget const*>& emitted)
{
  cmValue prop = tgt->GetProperty(propName);
  if (!prop) {
    return std::string();
  }

  cmGeneratorExpression ge(*tgt->Makefile->GetCMakeInstance());

  std::unique_ptr<cmGeneratorExpressionDAGChecker> parentDagChecker;
  if (propName == "INTERFACE_LINK_OPTIONS") {
    // To please constraint checks of DAGChecker, this property must have
    // LINK_OPTIONS property as parent
    parentDagChecker = cm::make_unique<cmGeneratorExpressionDAGChecker>(
      tgt, "LINK_OPTIONS", nullptr, nullptr);
  }
  cmGeneratorExpressionDAGChecker dagChecker(tgt, propName, nullptr,
                                             parentDagChecker.get());

  std::unique_ptr<cmCompiledGeneratorExpression> cge = ge.Parse(*prop);

  cmTarget dummyHead("try_compile_dummy_exe", cmStateEnums::EXECUTABLE,
                     cmTarget::Visibility::Normal, tgt->Target->GetMakefile(),
                     cmTarget::PerConfig::Yes);

  cmGeneratorTarget gDummyHead(&dummyHead, tgt->GetLocalGenerator());

  std::string result = cge->Evaluate(tgt->GetLocalGenerator(), this->Config,
                                     &gDummyHead, &dagChecker, tgt, language);

  const std::set<cmGeneratorTarget const*>& allTargets =
    cge->GetAllTargetsSeen();
  for (cmGeneratorTarget const* target : allTargets) {
    if (emitted.insert(target).second) {
      this->Exports.push_back(target);
    }
  }
  return result;
}